

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple_data_scatter_gather.cpp
# Opt level: O2

void duckdb::TupleDataTemplatedGather<signed_char>
               (TupleDataLayout *layout,Vector *row_locations,idx_t col_idx,
               SelectionVector *scan_sel,idx_t scan_count,Vector *target,SelectionVector *target_sel
               ,optional_ptr<duckdb::Vector,_true> param_8,
               vector<duckdb::TupleDataGatherFunction,_true> *param_9)

{
  data_ptr_t pdVar1;
  data_ptr_t pdVar2;
  value_type vVar3;
  const_reference pvVar4;
  ulong uVar5;
  ulong uVar6;
  ulong row_idx;
  ValidityBytes row_mask;
  
  pdVar1 = row_locations->data;
  pdVar2 = target->data;
  FlatVector::VerifyFlatVector(target);
  pvVar4 = vector<unsigned_long,_true>::get<true>(&layout->offsets,col_idx);
  vVar3 = *pvVar4;
  for (uVar6 = 0; scan_count != uVar6; uVar6 = uVar6 + 1) {
    uVar5 = uVar6;
    if (scan_sel->sel_vector != (sel_t *)0x0) {
      uVar5 = (ulong)scan_sel->sel_vector[uVar6];
    }
    row_idx = uVar6;
    if (target_sel->sel_vector != (sel_t *)0x0) {
      row_idx = (ulong)target_sel->sel_vector[uVar6];
    }
    pdVar2[row_idx] = *(data_t *)(*(long *)(pdVar1 + uVar5 * 8) + vVar3);
    row_mask.validity_mask = *(uchar **)(pdVar1 + uVar5 * 8);
    row_mask.capacity =
         ((long)(layout->types).
                super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                _M_impl.super__Vector_impl_data._M_finish -
         (long)(layout->types).
               super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
               super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl
               .super__Vector_impl_data._M_start) / 0x18;
    row_mask.validity_data.internal.
    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    row_mask.validity_data.internal.
    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if ((1 << ((byte)col_idx & 7) & (uint)row_mask.validity_mask[col_idx >> 3]) == 0) {
      TemplatedValidityMask<unsigned_long>::SetInvalid
                (&(target->validity).super_TemplatedValidityMask<unsigned_long>,row_idx);
    }
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&row_mask.validity_data.internal.
                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
  }
  return;
}

Assistant:

static void TupleDataTemplatedGather(const TupleDataLayout &layout, Vector &row_locations, const idx_t col_idx,
                                     const SelectionVector &scan_sel, const idx_t scan_count, Vector &target,
                                     const SelectionVector &target_sel, optional_ptr<Vector>,
                                     const vector<TupleDataGatherFunction> &) {
	// Source
	const auto source_locations = FlatVector::GetData<data_ptr_t>(row_locations);

	// Target
	auto target_data = FlatVector::GetData<T>(target);
	auto &target_validity = FlatVector::Validity(target);

	// Precompute mask indexes
	idx_t entry_idx;
	idx_t idx_in_entry;
	ValidityBytes::GetEntryIndex(col_idx, entry_idx, idx_in_entry);

	const auto offset_in_row = layout.GetOffsets()[col_idx];
	for (idx_t i = 0; i < scan_count; i++) {
		const auto &source_row = source_locations[scan_sel.get_index(i)];
		const auto target_idx = target_sel.get_index(i);
		target_data[target_idx] = Load<T>(source_row + offset_in_row);
		ValidityBytes row_mask(source_row, layout.ColumnCount());
		if (!row_mask.RowIsValid(row_mask.GetValidityEntryUnsafe(entry_idx), idx_in_entry)) {
			target_validity.SetInvalid(target_idx);
		}
#ifdef DEBUG
		else {
			TupleDataValueVerify<T>(target.GetType(), target_data[target_idx]);
		}
#endif
	}
}